

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_error.hpp
# Opt level: O3

string * __thiscall
jsoncons::bson::bson_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,bson_error_category_impl *this,int ev)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(ev) {
  case 1:
    pcVar2 = "Unexpected end of file";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Source error";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Illegal UTF-8 encoding in text string";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Data item nesting exceeds limit in options";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Request for the length of a string returned a non-positive result";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Request for the length of a binary returned a negative result";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Number too large";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Invalid decimal128 string";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "datetime too small";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "datetime too large";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Expected BSON document";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Invalid regex string";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Document or array size doesn\'t match bytes read";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "An unknown type was found in the stream";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown BSON parser error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
    {
        switch (static_cast<bson_errc>(ev))
        {
            case bson_errc::unexpected_eof:
                return "Unexpected end of file";
            case bson_errc::source_error:
                return "Source error";
            case bson_errc::invalid_utf8_text_string:
                return "Illegal UTF-8 encoding in text string";
            case bson_errc::max_nesting_depth_exceeded:
                return "Data item nesting exceeds limit in options";
            case bson_errc::string_length_is_non_positive:
                return "Request for the length of a string returned a non-positive result";
            case bson_errc::length_is_negative:
                return "Request for the length of a binary returned a negative result";
            case bson_errc::unknown_type:
                return "An unknown type was found in the stream";
            case bson_errc::number_too_large:
                return "Number too large";
            case bson_errc::invalid_decimal128_string:
                return "Invalid decimal128 string";
            case bson_errc::datetime_too_large:
                return "datetime too large";
            case bson_errc::datetime_too_small:
                return "datetime too small";
            case bson_errc::expected_bson_document:
                return "Expected BSON document";
            case bson_errc::invalid_regex_string:
                return "Invalid regex string";
            case bson_errc::size_mismatch:
                return "Document or array size doesn't match bytes read";
            default:
                return "Unknown BSON parser error";
        }
    }